

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int flatcc_builder_truncate_vector(flatcc_builder_t *B,size_t count)

{
  __flatcc_builder_frame_t *p_Var1;
  uint uVar2;
  uint uVar3;
  
  p_Var1 = B->frame;
  if (p_Var1->type != 4) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3ee,"int flatcc_builder_truncate_vector(flatcc_builder_t *, size_t)");
  }
  uVar2 = (p_Var1->container).table.pl_end;
  if (count <= uVar2) {
    (p_Var1->container).table.pl_end = uVar2 - (int)count;
    uVar3 = (int)count * (B->frame->container).table.vs_end;
    uVar2 = B->ds_offset - uVar3;
    B->ds_offset = uVar2;
    memset(B->ds + uVar2,0,(ulong)uVar3);
    return 0;
  }
  __assert_fail("(B->frame[0].container.vector.count) >= count",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x3ef,"int flatcc_builder_truncate_vector(flatcc_builder_t *, size_t)");
}

Assistant:

int flatcc_builder_truncate_vector(flatcc_builder_t *B, size_t count)
{
    check(frame(type) == flatcc_builder_vector, "expected vector frame");
    check_error(frame(container.vector.count) >= count, -1, "cannot truncate vector past empty");
    frame(container.vector.count) -= (uoffset_t)count;
    unpush_ds(B, frame(container.vector.elem_size) * (uoffset_t)count);
    return 0;
}